

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O1

void __thiscall
opengv::math::Bracket::divide
          (Bracket *this,
          list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *brackets)

{
  size_t *psVar1;
  double lowerBound;
  double upperBound;
  Bracket *pBVar2;
  _Node *p_Var3;
  Ptr upperBracket;
  Ptr lowerBracket;
  shared_ptr<opengv::math::Bracket> local_38;
  shared_ptr<opengv::math::Bracket> local_28;
  
  lowerBound = this->_lowerBound;
  upperBound = (lowerBound + this->_upperBound) * 0.5;
  pBVar2 = (Bracket *)operator_new(0x30);
  Bracket(pBVar2,lowerBound,upperBound,this->_lowerBoundChanges,false);
  local_28.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pBVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<opengv::math::Bracket*>
            (&local_28.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pBVar2);
  pBVar2 = (Bracket *)operator_new(0x30);
  Bracket(pBVar2,upperBound,this->_upperBound,this->_upperBoundChanges,true);
  local_38.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pBVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<opengv::math::Bracket*>
            (&local_38.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pBVar2);
  p_Var3 = std::__cxx11::
           list<std::shared_ptr<opengv::math::Bracket>,std::allocator<std::shared_ptr<opengv::math::Bracket>>>
           ::_M_create_node<std::shared_ptr<opengv::math::Bracket>const&>
                     ((list<std::shared_ptr<opengv::math::Bracket>,std::allocator<std::shared_ptr<opengv::math::Bracket>>>
                       *)brackets,&local_28);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = &(brackets->
            super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var3 = std::__cxx11::
           list<std::shared_ptr<opengv::math::Bracket>,std::allocator<std::shared_ptr<opengv::math::Bracket>>>
           ::_M_create_node<std::shared_ptr<opengv::math::Bracket>const&>
                     ((list<std::shared_ptr<opengv::math::Bracket>,std::allocator<std::shared_ptr<opengv::math::Bracket>>>
                       *)brackets,&local_38);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = &(brackets->
            super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_38.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_28.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void
opengv::math::Bracket::divide( std::list<Ptr> & brackets ) const
{
  double center = (_upperBound + _lowerBound) / 2.0;
  Ptr lowerBracket(new Bracket(_lowerBound,center,_lowerBoundChanges,false));
  Ptr upperBracket(new Bracket(center,_upperBound,_upperBoundChanges,true));
  brackets.push_back(lowerBracket);
  brackets.push_back(upperBracket);
}